

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_gej_has_quad_y_var(secp256k1_gej *a)

{
  long in_RDI;
  secp256k1_fe yz;
  secp256k1_fe *in_stack_00000048;
  secp256k1_fe *in_stack_ffffffffffffffc8;
  secp256k1_fe *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x78) == 0) {
    secp256k1_fe_impl_mul
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(secp256k1_fe *)0x137438);
    local_4 = secp256k1_fe_impl_is_square_var(in_stack_00000048);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_gej_has_quad_y_var(const secp256k1_gej *a) {
    secp256k1_fe yz;

    if (a->infinity) {
        return 0;
    }

    /* We rely on the fact that the Jacobi symbol of 1 / a->z^3 is the same as
     * that of a->z. Thus a->y / a->z^3 is a quadratic residue iff a->y * a->z
       is */
    secp256k1_fe_mul(&yz, &a->y, &a->z);
    return secp256k1_fe_is_square_var(&yz);
}